

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O1

bool CheckShader(GLuint handle,char *desc)

{
  undefined1 uVar1;
  undefined1 extraout_AL;
  int iVar2;
  uint uVar3;
  ImVector<char> buf;
  GLint log_length;
  GLint status;
  GLchar *pGStack_40;
  GLint local_38;
  GLint local_34;
  
  local_34 = 0;
  local_38 = 0;
  (*gl3wGetShaderiv)(handle,0x8b81,&local_34);
  uVar1 = (*gl3wGetShaderiv)(handle,0x8b84,&local_38);
  if ((char)local_34 == '\0') {
    iVar2 = fprintf(_stderr,"ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s!\n",
                    desc);
    uVar1 = (undefined1)iVar2;
  }
  if (1 < local_38) {
    pGStack_40 = (GLchar *)0x0;
    if (-1 < local_38) {
      uVar3 = 8;
      if (7 < (int)(local_38 + 1U)) {
        uVar3 = local_38 + 1U;
      }
      if (0 < (int)uVar3) {
        pGStack_40 = (GLchar *)ImGui::MemAlloc((ulong)uVar3);
      }
    }
    (*gl3wGetShaderInfoLog)(handle,local_38,(GLsizei *)0x0,pGStack_40);
    iVar2 = fprintf(_stderr,"%s\n",pGStack_40);
    uVar1 = (undefined1)iVar2;
    if (pGStack_40 != (GLchar *)0x0) {
      ImGui::MemFree(pGStack_40);
      uVar1 = extraout_AL;
    }
  }
  return (bool)uVar1;
}

Assistant:

static bool CheckShader(GLuint handle, const char* desc)
{
    GLint status = 0, log_length = 0;
    glGetShaderiv(handle, GL_COMPILE_STATUS, &status);
    glGetShaderiv(handle, GL_INFO_LOG_LENGTH, &log_length);
    if ((GLboolean)status == GL_FALSE)
        fprintf(stderr, "ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s!\n", desc);
    if (log_length > 1)
    {
        ImVector<char> buf;
        buf.resize((int)(log_length + 1));
        glGetShaderInfoLog(handle, log_length, NULL, (GLchar*)buf.begin());
        fprintf(stderr, "%s\n", buf.begin());
    }
    return (GLboolean)status == GL_TRUE;
}